

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  size_t sVar4;
  BYTE *pBVar5;
  size_t sVar6;
  seq_t sequence;
  seq_t sequence_00;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  BYTE *op_2;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  BYTE *pBVar14;
  byte bVar15;
  BYTE *oend_00;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *op;
  BYTE *oend;
  ulong *puVar20;
  ZSTD_seqSymbol ZVar21;
  BYTE *pBVar22;
  long *plVar23;
  ZSTD_seqSymbol ZVar24;
  BYTE *pBVar25;
  ZSTD_seqSymbol ZVar26;
  ZSTD_seqSymbol ZVar27;
  ulong uVar28;
  BYTE *pBVar29;
  size_t sVar30;
  size_t srcSize_00;
  ulong uVar31;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffdd8;
  ZSTD_seqSymbol local_1e0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  uint local_1a8;
  uint local_1a4;
  ulong local_1a0;
  ZSTD_seqSymbol *local_198;
  BIT_DStream_t local_190;
  ZSTD_fseState local_168;
  ZSTD_fseState local_158;
  ZSTD_fseState local_148;
  ZSTD_seqSymbol local_138 [3];
  BYTE *local_120 [2];
  long local_110;
  BYTE *local_108;
  ulong *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  ulong *local_e8;
  BYTE *local_e0;
  ulong *local_d8;
  ZSTD_seqSymbol local_d0;
  BYTE *local_c8;
  BYTE *local_c0;
  ZSTD_seqSymbol local_b8;
  size_t local_b0;
  ZSTD_seqSymbol local_a8;
  long local_a0 [14];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar11 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  srcSize_00 = srcSize - sVar11;
  iVar8 = dctx->ddictIsCold;
  sVar12 = ZSTD_decodeSeqHeaders(dctx,(int *)&local_1a4,(void *)(sVar11 + (long)src),srcSize_00);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  puVar20 = (ulong *)((long)(sVar11 + (long)src) + sVar12);
  sVar11 = srcSize_00 - sVar12;
  if (iVar8 == 0) {
    if (frame == 0) {
      if ((int)local_1a4 < 5) goto LAB_0014ddc1;
    }
    else if ((dctx->fParams).windowSize < 0x1000001 || (int)local_1a4 < 5) {
LAB_0014ddc1:
      dctx->ddictIsCold = 0;
      goto LAB_0014ddcc;
    }
    iVar8 = 0;
    uVar9 = 1;
    do {
      iVar8 = (iVar8 + 1) - (uint)(dctx->OFTptr[(ulong)(uVar9 - 1) + 1].nbAdditionalBits < 0x17);
      bVar15 = (byte)dctx->OFTptr->baseValue;
      uVar7 = uVar9 >> (bVar15 & 0x1f);
      uVar9 = uVar9 + 1;
    } while (uVar7 == 0);
    dctx->ddictIsCold = 0;
    if ((uint)(iVar8 << (8 - bVar15 & 0x1f)) < 7) {
LAB_0014ddcc:
      sVar11 = ZSTD_decompressSequences
                         (dctx,dst,dstCapacity,puVar20,sVar11,local_1a4,in_stack_fffffffffffffdd8);
      return sVar11;
    }
  }
  else {
    dctx->ddictIsCold = 0;
  }
  if (dctx->bmi2 != 0) {
    sVar11 = ZSTD_decompressSequencesLong_bmi2
                       (dctx,dst,dstCapacity,puVar20,sVar11,local_1a4,in_stack_fffffffffffffdd8);
    return sVar11;
  }
  oend_00 = (BYTE *)(dstCapacity + (long)dst);
  local_1b8 = dctx->litPtr;
  sVar4 = dctx->litSize;
  op = (BYTE *)dst;
  pBVar29 = local_1b8 + sVar4;
  if (local_1a4 == 0) {
LAB_0014ed0a:
    uVar31 = (long)pBVar29 - (long)local_1b8;
    if (uVar31 <= (ulong)((long)oend_00 - (long)op)) {
      memcpy(op,local_1b8,uVar31);
      return (size_t)(op + (uVar31 - (long)dst));
    }
    return 0xffffffffffffffba;
  }
  local_1b0 = (BYTE *)dctx->prefixStart;
  local_f0 = (BYTE *)dctx->virtualStart;
  local_120[1] = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar16 = -0xc;
  do {
    *(ulong *)((long)local_120 + lVar16 * 2) = (ulong)*(uint *)((long)dctx->workspace + lVar16);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0);
  local_1a8 = 4;
  if ((int)local_1a4 < 4) {
    local_1a8 = local_1a4;
  }
  local_110 = (long)dst - (long)local_1b0;
  if (srcSize_00 == sVar12) {
    return 0xffffffffffffffec;
  }
  local_190.limitPtr = (char *)(puVar20 + 1);
  if (sVar11 < 8) {
    local_190.bitContainer = (size_t)(byte)*puVar20;
    switch(sVar11) {
    case 7:
      local_190.bitContainer = local_190.bitContainer | (ulong)*(byte *)((long)puVar20 + 6) << 0x30;
    case 6:
      local_190.bitContainer =
           local_190.bitContainer + ((ulong)*(byte *)((long)puVar20 + 5) << 0x28);
    case 5:
      local_190.bitContainer =
           local_190.bitContainer + ((ulong)*(byte *)((long)puVar20 + 4) << 0x20);
    case 4:
      local_190.bitContainer =
           local_190.bitContainer + (ulong)*(byte *)((long)puVar20 + 3) * 0x1000000;
    case 3:
      local_190.bitContainer =
           local_190.bitContainer + (ulong)*(byte *)((long)puVar20 + 2) * 0x10000;
    case 2:
      local_190.bitContainer = (ulong)*(byte *)((long)puVar20 + 1) * 0x100 + local_190.bitContainer;
    }
    bVar15 = *(byte *)((long)src + (srcSize - 1));
    if (bVar15 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = 0x1f;
    if (bVar15 != 0) {
      for (; bVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    local_190.bitsConsumed = (uVar9 ^ 0x1f) + (int)sVar11 * -8 + 0x29;
    local_190.ptr = (char *)puVar20;
  }
  else {
    local_190.ptr = (char *)((srcSize - 8) + (long)src);
    local_190.bitContainer = *(size_t *)local_190.ptr;
    if (local_190.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = 0x1f;
    bVar15 = (byte)(local_190.bitContainer >> 0x38);
    if (bVar15 != 0) {
      for (; bVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    local_190.bitsConsumed = ~uVar9 + 9;
    if (0xffffffffffffff88 < sVar11) {
      return 0xffffffffffffffec;
    }
  }
  local_190.start = (char *)puVar20;
  local_120[0] = local_1b0;
  local_108 = local_1b8 + sVar4;
  local_f8 = local_120[1];
  ZSTD_initFseState(&local_168,&local_190,dctx->LLTptr);
  ZSTD_initFseState(&local_158,&local_190,dctx->OFTptr);
  ZSTD_initFseState(&local_148,&local_190,dctx->MLTptr);
  uVar31 = (ulong)local_190.bitsConsumed;
  uVar17 = 0;
  if (local_190.bitsConsumed < 0x41) {
    local_100 = (ulong *)local_190.limitPtr;
    local_d8 = (ulong *)local_190.start;
    local_198 = local_158.table;
    local_c0 = local_120[1];
    local_c8 = local_120[0];
    local_e0 = (BYTE *)0x0;
    uVar17 = 0;
    if (0 < (int)local_1a8) {
      uVar17 = (ulong)local_1a8;
    }
    local_d0 = local_138[1];
    plVar23 = local_a0;
    puVar20 = (ulong *)local_190.ptr;
    ZVar27 = local_138[0];
    uVar18 = local_190.bitContainer;
    do {
      if (puVar20 < local_190.limitPtr) {
        if (puVar20 != (ulong *)local_190.start) {
          uVar18 = (ulong)(uint)((int)puVar20 - (int)local_190.start);
          if (local_190.start <= (ulong *)((long)puVar20 - (uVar31 >> 3))) {
            uVar18 = uVar31 >> 3;
          }
          local_190.bitsConsumed = (uint)uVar31 + (int)uVar18 * -8;
          goto LAB_0014e02c;
        }
      }
      else {
        uVar18 = uVar31 >> 3;
        local_190.bitsConsumed = (uint)uVar31 & 7;
LAB_0014e02c:
        puVar20 = (ulong *)((long)puVar20 - uVar18);
        uVar31 = (ulong)local_190.bitsConsumed;
        uVar18 = *puVar20;
        local_190.bitContainer = uVar18;
        local_190.ptr = (char *)puVar20;
      }
      if ((BYTE *)uVar17 == local_e0) goto LAB_0014e339;
      bVar15 = local_168.table[local_168.state].nbAdditionalBits;
      bVar1 = local_148.table[local_148.state].nbAdditionalBits;
      bVar2 = local_158.table[local_158.state].nbAdditionalBits;
      local_1a0 = (ulong)local_148.table[local_148.state].baseValue;
      uVar9 = (uint)bVar2;
      if (bVar2 != 0) {
        ZVar26 = (ZSTD_seqSymbol)
                 (((uVar18 << ((byte)uVar31 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_158.table[local_158.state].baseValue);
        uVar31 = (ulong)((int)uVar31 + uVar9);
        if (uVar9 == 1) goto LAB_0014e0cc;
        goto LAB_0014e10e;
      }
      ZVar26.nextState = 0;
      ZVar26.nbAdditionalBits = '\0';
      ZVar26.nbBits = '\0';
      ZVar26.baseValue = 0;
LAB_0014e0cc:
      lVar16 = (ulong)((ulong)local_168.table[local_168.state].baseValue == 0) + (long)ZVar26;
      if (lVar16 != 0) {
        if (lVar16 == 3) {
          ZVar26 = (ZSTD_seqSymbol)(((long)ZVar27 - 1U) + (ulong)(ZVar27 == (ZSTD_seqSymbol)0x1));
LAB_0014e10e:
          local_138[2] = local_d0;
        }
        else {
          ZVar26 = (ZSTD_seqSymbol)
                   ((long)local_138[lVar16] + (ulong)(local_138[lVar16] == (ZSTD_seqSymbol)0x0));
          if (lVar16 != 1) goto LAB_0014e10e;
        }
        local_138[1] = ZVar27;
        local_138[0] = ZVar26;
        local_d0 = ZVar27;
        ZVar27 = ZVar26;
      }
      if (bVar1 == 0) {
        uVar28 = 0;
      }
      else {
        uVar28 = (uVar18 << ((byte)uVar31 & 0x3f)) >> (-bVar1 & 0x3f);
        uVar31 = (ulong)((int)uVar31 + (uint)bVar1);
      }
      uVar7 = (uint)uVar31;
      if ((0x1e < (uint)bVar1 + (uint)bVar15 + uVar9) && (uVar7 < 0x41)) {
        if (puVar20 < local_190.limitPtr) {
          if (puVar20 == (ulong *)local_190.start) goto LAB_0014e1cb;
          uVar18 = (ulong)(uint)((int)puVar20 - (int)local_190.start);
          if (local_190.start <= (ulong *)((long)puVar20 - (uVar31 >> 3))) {
            uVar18 = uVar31 >> 3;
          }
          uVar7 = uVar7 + (int)uVar18 * -8;
        }
        else {
          uVar18 = uVar31 >> 3;
          uVar7 = uVar7 & 7;
        }
        puVar20 = (ulong *)((long)puVar20 - uVar18);
        uVar18 = *puVar20;
        local_190.bitContainer = uVar18;
        local_190.ptr = (char *)puVar20;
      }
LAB_0014e1cb:
      local_e8 = puVar20;
      if (bVar15 == 0) {
        uVar31 = 0;
      }
      else {
        uVar31 = (uVar18 << ((byte)uVar7 & 0x3f)) >> (-bVar15 & 0x3f);
        uVar7 = uVar7 + bVar15;
      }
      lVar16 = uVar31 + local_168.table[local_168.state].baseValue;
      ZVar26 = (ZSTD_seqSymbol)(local_110 + lVar16);
      pBVar29 = local_c8;
      if ((ulong)ZVar26 < (ulong)ZVar27) {
        pBVar29 = local_120[1];
      }
      local_110 = local_1a0 + uVar28 + (long)ZVar26;
      iVar8 = uVar7 + local_168.table[local_168.state].nbBits;
      local_168.state =
           (ulong)((uint)(uVar18 >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_168.table[local_168.state].nbBits]) +
           (ulong)local_168.table[local_168.state].nextState;
      iVar8 = iVar8 + (uint)local_148.table[local_148.state].nbBits;
      local_148.state =
           (ulong)((uint)(uVar18 >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_148.table[local_148.state].nbBits]) +
           (ulong)local_148.table[local_148.state].nextState;
      local_190.bitsConsumed = iVar8 + (uint)local_158.table[local_158.state].nbBits;
      uVar31 = (ulong)local_190.bitsConsumed;
      local_158.state =
           (ulong)((uint)(uVar18 >> (-(char)local_190.bitsConsumed & 0x3fU)) &
                  BIT_mask[local_158.table[local_158.state].nbBits]) +
           (ulong)local_158.table[local_158.state].nextState;
      plVar23[-3] = lVar16;
      plVar23[-2] = local_1a0 + uVar28;
      *(ZSTD_seqSymbol *)(plVar23 + -1) = ZVar27;
      *plVar23 = (long)(pBVar29 + ((long)ZVar26 - (long)ZVar27));
      local_e0 = (BYTE *)((long)local_e0 + 1);
      plVar23 = plVar23 + 4;
    } while (local_190.bitsConsumed < 0x41);
    uVar17 = (ulong)local_e0 & 0xffffffff;
  }
  if ((int)local_1a8 <= (int)uVar17) {
LAB_0014e339:
    local_100 = (ulong *)(oend_00 + -0xd);
    local_e0 = oend_00 + -8;
    while( true ) {
      ZVar27 = local_138[1];
      uVar9 = (uint)uVar31;
      uVar7 = (uint)uVar17;
      if (0x40 < uVar9) break;
      if (local_190.ptr < local_190.limitPtr) {
        if (local_190.ptr != local_190.start) {
          uVar17 = (ulong)(uint)((int)local_190.ptr - (int)local_190.start);
          if (local_190.start <= (ulong *)((long)local_190.ptr - (uVar31 >> 3))) {
            uVar17 = uVar31 >> 3;
          }
          local_190.bitsConsumed = uVar9 + (int)uVar17 * -8;
          goto LAB_0014e3c4;
        }
      }
      else {
        uVar17 = uVar31 >> 3;
        local_190.bitsConsumed = uVar9 & 7;
LAB_0014e3c4:
        local_190.ptr = (char *)((long)local_190.ptr - uVar17);
        uVar31 = (ulong)local_190.bitsConsumed;
        local_190.bitContainer = *(size_t *)local_190.ptr;
      }
      if ((int)local_1a4 <= (int)uVar7) goto LAB_0014ea0e;
      bVar15 = local_168.table[local_168.state].nbAdditionalBits;
      bVar1 = local_148.table[local_148.state].nbAdditionalBits;
      bVar2 = local_158.table[local_158.state].nbAdditionalBits;
      uVar9 = (uint)bVar2;
      if (bVar2 == 0) {
        ZVar21.nextState = 0;
        ZVar21.nbAdditionalBits = '\0';
        ZVar21.nbBits = '\0';
        ZVar21.baseValue = 0;
LAB_0014e478:
        lVar16 = (ulong)((ulong)local_168.table[local_168.state].baseValue == 0) + (long)ZVar21;
        if (lVar16 != 0) {
          if (lVar16 == 3) {
            local_1e0 = (ZSTD_seqSymbol)
                        (((long)local_138[0] - 1U) + (ulong)(local_138[0] == (ZSTD_seqSymbol)0x1));
LAB_0014e4f7:
            local_138[2] = local_138[1];
          }
          else {
            local_1e0 = (ZSTD_seqSymbol)
                        ((long)local_138[lVar16] + (ulong)(local_138[lVar16] == (ZSTD_seqSymbol)0x0)
                        );
            if (lVar16 != 1) goto LAB_0014e4f7;
          }
          local_138[1] = local_138[0];
          local_138[0] = local_1e0;
        }
      }
      else {
        ZVar21 = (ZSTD_seqSymbol)
                 (((local_190.bitContainer << ((byte)uVar31 & 0x3f)) >> (-bVar2 & 0x3f)) +
                 (ulong)local_158.table[local_158.state].baseValue);
        uVar31 = (ulong)((int)uVar31 + uVar9);
        if (uVar9 == 1) goto LAB_0014e478;
        local_138[1] = local_138[0];
        local_138[2] = ZVar27;
        local_138[0] = ZVar21;
      }
      ZVar27 = local_138[0];
      if (bVar1 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (local_190.bitContainer << ((byte)uVar31 & 0x3f)) >> (-bVar1 & 0x3f);
        uVar31 = (ulong)((int)uVar31 + (uint)bVar1);
      }
      uVar10 = (uint)uVar31;
      if ((0x1e < (uint)bVar1 + (uint)bVar15 + uVar9) && (uVar10 < 0x41)) {
        if (local_190.ptr < local_190.limitPtr) {
          if (local_190.ptr == local_190.start) goto LAB_0014e5c7;
          uVar18 = (ulong)(uint)((int)local_190.ptr - (int)local_190.start);
          if (local_190.start <= (ulong *)((long)local_190.ptr - (uVar31 >> 3))) {
            uVar18 = uVar31 >> 3;
          }
          uVar10 = uVar10 + (int)uVar18 * -8;
        }
        else {
          uVar18 = uVar31 >> 3;
          uVar10 = uVar10 & 7;
        }
        local_190.ptr = (char *)((long)local_190.ptr - uVar18);
        local_190.bitContainer = *(size_t *)local_190.ptr;
      }
LAB_0014e5c7:
      if (bVar15 == 0) {
        uVar31 = 0;
      }
      else {
        uVar31 = (local_190.bitContainer << ((byte)uVar10 & 0x3f)) >> (-bVar15 & 0x3f);
        uVar10 = uVar10 + bVar15;
      }
      ZVar21 = (ZSTD_seqSymbol)(uVar17 + local_148.table[local_148.state].baseValue);
      ZVar24 = (ZSTD_seqSymbol)(uVar31 + local_168.table[local_168.state].baseValue);
      ZVar26 = (ZSTD_seqSymbol)(local_110 + (long)ZVar24);
      pBVar5 = local_120[(ulong)ZVar26 < (ulong)local_138[0]];
      local_110 = (long)ZVar26 + (long)ZVar21;
      iVar8 = uVar10 + local_168.table[local_168.state].nbBits;
      local_168.state =
           (ulong)((uint)(local_190.bitContainer >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_168.table[local_168.state].nbBits]) +
           (ulong)local_168.table[local_168.state].nextState;
      iVar8 = iVar8 + (uint)local_148.table[local_148.state].nbBits;
      local_148.state =
           (ulong)((uint)(local_190.bitContainer >> (-(char)iVar8 & 0x3fU)) &
                  BIT_mask[local_148.table[local_148.state].nbBits]) +
           (ulong)local_148.table[local_148.state].nextState;
      local_190.bitsConsumed = iVar8 + (uint)local_158.table[local_158.state].nbBits;
      local_158.state =
           (ulong)((uint)(local_190.bitContainer >> (-(char)local_190.bitsConsumed & 0x3fU)) &
                  BIT_mask[local_158.table[local_158.state].nbBits]) +
           (ulong)local_158.table[local_158.state].nextState;
      uVar18 = (ulong)((uVar7 & 3) << 5);
      uVar17 = *(ulong *)((long)&local_b8.nextState + uVar18);
      sVar6 = *(size_t *)((long)&local_b0 + uVar18);
      uVar31 = sVar6 + uVar17;
      pBVar29 = op + uVar31;
      if (oend_00 < pBVar29) {
        return 0xffffffffffffffba;
      }
      pBVar14 = local_1b8 + uVar17;
      if (local_108 < pBVar14) {
        return 0xffffffffffffffec;
      }
      local_198 = (ZSTD_seqSymbol *)((long)&local_b8.nextState + uVar18);
      pBVar22 = op + uVar17;
      if (local_e0 < pBVar22) {
        sequence.matchLength = *(undefined8 *)((long)&local_b0 + uVar18);
        sequence.litLength._0_2_ = local_198->nextState;
        sequence.litLength._2_1_ = local_198->nbAdditionalBits;
        sequence.litLength._3_1_ = local_198->nbBits;
        sequence.litLength._4_4_ = local_198->baseValue;
        sequence.offset = *(undefined8 *)((long)local_a0 + (uVar18 - 8));
        sequence.match = *(BYTE **)((long)local_a0 + uVar18);
        uVar31 = ZSTD_execSequenceLast7
                           (op,oend_00,sequence,&local_1b8,local_108,local_1b0,local_f0,local_f8);
      }
      else {
        local_e8 = *(ulong **)((long)local_a0 + (uVar18 - 8));
        pBVar25 = *(BYTE **)((long)local_a0 + uVar18);
        *(undefined8 *)op = *(undefined8 *)local_1b8;
        if (8 < uVar17) {
          pBVar19 = op + 8;
          do {
            local_1b8 = local_1b8 + 8;
            *(undefined8 *)pBVar19 = *(undefined8 *)local_1b8;
            pBVar19 = pBVar19 + 8;
          } while (pBVar19 < pBVar22);
        }
        sVar13 = sVar6;
        local_1b8 = pBVar14;
        local_1a0 = uVar31;
        if (pBVar22 + -(long)local_1b0 < local_e8) {
          if (pBVar22 + -(long)local_f0 < local_e8) {
            return 0xffffffffffffffec;
          }
          if (local_f8 < pBVar25 + sVar6) {
            sVar30 = (long)local_f8 - (long)pBVar25;
            memmove(pBVar22,pBVar25,sVar30);
            pBVar22 = pBVar22 + sVar30;
            sVar13 = sVar6 - sVar30;
            if ((pBVar22 <= local_e0) && (pBVar25 = local_1b0, 2 < sVar13)) goto LAB_0014e87b;
            uVar31 = local_1a0;
            if (sVar6 != sVar30) {
              uVar17 = 0;
              do {
                pBVar22[uVar17] = local_1b0[uVar17];
                uVar17 = uVar17 + 1;
              } while ((uVar17 & 0xffffffff) < sVar13);
            }
          }
          else {
            memmove(pBVar22,pBVar25,sVar6);
            uVar31 = local_1a0;
          }
        }
        else {
LAB_0014e87b:
          if (local_e8 < (ulong *)0x8) {
            iVar8 = *(int *)(ZSTD_execSequence_dec64table + (long)local_e8 * 4);
            *pBVar22 = *pBVar25;
            pBVar22[1] = pBVar25[1];
            pBVar22[2] = pBVar25[2];
            pBVar22[3] = pBVar25[3];
            pBVar14 = pBVar25 + *(uint *)(ZSTD_execSequence_dec32table + (long)local_e8 * 4);
            pBVar25 = pBVar25 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + (long)local_e8 * 4)
                                - (long)iVar8);
            *(undefined4 *)(pBVar22 + 4) = *(undefined4 *)pBVar14;
          }
          else {
            *(undefined8 *)pBVar22 = *(undefined8 *)pBVar25;
          }
          pBVar14 = pBVar22 + 8;
          pBVar25 = pBVar25 + 8;
          uVar31 = local_1a0;
          if (local_100 < pBVar29) {
            pBVar22 = pBVar14;
            pBVar19 = pBVar25;
            if (pBVar14 < local_e0) {
              do {
                *(undefined8 *)pBVar22 = *(undefined8 *)pBVar19;
                pBVar22 = pBVar22 + 8;
                pBVar19 = pBVar19 + 8;
              } while (pBVar22 < local_e0);
              pBVar25 = pBVar25 + ((long)local_e0 - (long)pBVar14);
              pBVar14 = local_e0;
            }
            for (; pBVar14 < pBVar29; pBVar14 = pBVar14 + 1) {
              BVar3 = *pBVar25;
              pBVar25 = pBVar25 + 1;
              *pBVar14 = BVar3;
            }
          }
          else {
            do {
              *(undefined8 *)pBVar14 = *(undefined8 *)pBVar25;
              pBVar14 = pBVar14 + 8;
              pBVar25 = pBVar25 + 8;
            } while (pBVar14 < pBVar22 + sVar13);
          }
        }
      }
      if (0xffffffffffffff88 < uVar31) {
        return uVar31;
      }
      *local_198 = ZVar24;
      local_198[1] = ZVar21;
      local_198[2] = ZVar27;
      local_198[3] = (ZSTD_seqSymbol)((long)pBVar5 + ((long)ZVar26 - (long)ZVar27));
      op = op + uVar31;
      uVar17 = (ulong)(uVar7 + 1);
      uVar31 = (ulong)local_190.bitsConsumed;
    }
    if ((int)local_1a4 <= (int)uVar7) {
LAB_0014ea0e:
      uVar7 = uVar7 - local_1a8;
      if ((int)uVar7 < (int)local_1a4) {
        pBVar29 = oend_00 + -8;
        do {
          uVar18 = (ulong)((uVar7 & 3) << 5);
          uVar17 = *(ulong *)((long)&local_b8.nextState + uVar18);
          sVar6 = *(size_t *)((long)&local_b0 + uVar18);
          uVar31 = sVar6 + uVar17;
          pBVar5 = op + uVar31;
          if (oend_00 < pBVar5) {
            return 0xffffffffffffffba;
          }
          pBVar14 = local_1b8 + uVar17;
          if (local_108 < pBVar14) {
            return 0xffffffffffffffec;
          }
          pBVar22 = op + uVar17;
          if (pBVar29 < pBVar22) {
            sequence_00.matchLength = *(undefined8 *)((long)&local_b0 + uVar18);
            sequence_00.litLength = *(undefined8 *)((long)&local_b8.nextState + uVar18);
            sequence_00.offset = *(undefined8 *)((long)local_a0 + (uVar18 - 8));
            sequence_00.match = *(BYTE **)((long)local_a0 + uVar18);
            uVar31 = ZSTD_execSequenceLast7
                               (op,oend_00,sequence_00,&local_1b8,local_108,local_1b0,local_f0,
                                local_f8);
          }
          else {
            uVar28 = *(ulong *)((long)local_a0 + (uVar18 - 8));
            pBVar25 = *(BYTE **)((long)local_a0 + uVar18);
            *(undefined8 *)op = *(undefined8 *)local_1b8;
            if (8 < uVar17) {
              pBVar19 = op + 8;
              do {
                local_1b8 = local_1b8 + 8;
                *(undefined8 *)pBVar19 = *(undefined8 *)local_1b8;
                pBVar19 = pBVar19 + 8;
              } while (pBVar19 < pBVar22);
            }
            sVar13 = sVar6;
            local_1b8 = pBVar14;
            if ((ulong)((long)pBVar22 - (long)local_1b0) < uVar28) {
              if ((ulong)((long)pBVar22 - (long)local_f0) < uVar28) {
                return 0xffffffffffffffec;
              }
              if (local_f8 < pBVar25 + sVar6) {
                sVar30 = (long)local_f8 - (long)pBVar25;
                memmove(pBVar22,pBVar25,sVar30);
                pBVar22 = pBVar22 + sVar30;
                sVar13 = sVar6 - sVar30;
                if ((pBVar22 <= pBVar29) && (pBVar25 = local_1b0, 2 < sVar13)) goto LAB_0014ebba;
                if (sVar6 != sVar30) {
                  uVar17 = 0;
                  do {
                    pBVar22[uVar17] = local_1b0[uVar17];
                    uVar17 = uVar17 + 1;
                  } while ((uVar17 & 0xffffffff) < sVar13);
                }
              }
              else {
                memmove(pBVar22,pBVar25,sVar6);
              }
            }
            else {
LAB_0014ebba:
              if (uVar28 < 8) {
                iVar8 = *(int *)(ZSTD_execSequence_dec64table + uVar28 * 4);
                *pBVar22 = *pBVar25;
                pBVar22[1] = pBVar25[1];
                pBVar22[2] = pBVar25[2];
                pBVar22[3] = pBVar25[3];
                pBVar14 = pBVar25 + *(uint *)(ZSTD_execSequence_dec32table + uVar28 * 4);
                pBVar25 = pBVar25 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar28 * 4) -
                                    (long)iVar8);
                *(undefined4 *)(pBVar22 + 4) = *(undefined4 *)pBVar14;
              }
              else {
                *(undefined8 *)pBVar22 = *(undefined8 *)pBVar25;
              }
              pBVar14 = pBVar22 + 8;
              pBVar25 = pBVar25 + 8;
              if (local_100 < pBVar5) {
                pBVar22 = pBVar14;
                pBVar19 = pBVar25;
                if (pBVar14 < pBVar29) {
                  do {
                    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar19;
                    pBVar22 = pBVar22 + 8;
                    pBVar19 = pBVar19 + 8;
                  } while (pBVar22 < pBVar29);
                  pBVar25 = pBVar25 + ((long)pBVar29 - (long)pBVar14);
                  pBVar14 = pBVar29;
                }
                for (; pBVar14 < pBVar5; pBVar14 = pBVar14 + 1) {
                  BVar3 = *pBVar25;
                  pBVar25 = pBVar25 + 1;
                  *pBVar14 = BVar3;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar14 = *(undefined8 *)pBVar25;
                  pBVar14 = pBVar14 + 8;
                  pBVar25 = pBVar25 + 8;
                } while (pBVar14 < pBVar22 + sVar13);
              }
            }
          }
          if (0xffffffffffffff88 < uVar31) {
            return uVar31;
          }
          op = op + uVar31;
          uVar7 = uVar7 + 1;
        } while (uVar7 != local_1a4);
      }
      lVar16 = 0;
      do {
        (dctx->entropy).rep[lVar16] = *(U32 *)(local_138 + lVar16);
        lVar16 = lVar16 + 1;
        pBVar29 = local_108;
      } while (lVar16 != 3);
      goto LAB_0014ed0a;
    }
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}